

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O2

void __thiscall Am_Web_Data::Invalidate(Am_Web_Data *this,Am_Slot *slot_invalidated)

{
  Output_Port *this_00;
  Output_Port **ppOVar1;
  
  this->valid = false;
  ppOVar1 = &this->out_list;
  while (this_00 = *ppOVar1, this_00 != (Output_Port *)0x0) {
    if ((this_00->context).data != slot_invalidated->data) {
      Am_Slot::Invalidate(&this_00->context,&(this->interface).super_Am_Constraint);
    }
    ppOVar1 = &this_00->next;
  }
  return;
}

Assistant:

void
Am_Web_Data::Invalidate(const Am_Slot &slot_invalidated)
{
  valid = false;
  Output_Port *curr;
  for (curr = out_list; curr; curr = curr->next) {
    if (curr->context != slot_invalidated)
      curr->context.Invalidate(&interface);
  }
}